

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O2

int tclpkcs11_listmechs(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  _func_int_Tcl_Interp_ptr_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var1;
  int iVar2;
  long lVar3;
  void *__ptr;
  Tcl_Obj *pTVar4;
  char *pcVar5;
  Tcl_Obj *pTVar6;
  uint uVar7;
  char *__format;
  char *pcVar8;
  ProcErrorProc *pPVar9;
  CK_ULONG MechanismCount;
  long slotid_long;
  char bufmech [256];
  
  MechanismCount = 0;
  if (cd == (ClientData)0x0) {
    pPVar9 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "invalid clientdata";
  }
  else if (objc == 3) {
    pTVar4 = objv[2];
    lVar3 = (**(code **)((long)cd + 0x40))(cd,objv[1]);
    if ((lVar3 != 0) && (lVar3 = *(long *)(lVar3 + 0x18), lVar3 != 0)) {
      iVar2 = (*tclStubsPtr->tcl_GetLongFromObj)((Tcl_Interp_conflict *)interp,pTVar4,&slotid_long);
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = (**(code **)(*(long *)(lVar3 + 8) + 0x40))(slotid_long,0,&MechanismCount);
      if (iVar2 != 0) {
        return iVar2;
      }
      __ptr = malloc(MechanismCount << 3);
      iVar2 = (**(code **)(*(long *)(lVar3 + 8) + 0x40))(slotid_long,__ptr,&MechanismCount);
      if (iVar2 != 0) {
        return iVar2;
      }
      pTVar4 = (*tclStubsPtr->tcl_NewObj)();
      for (uVar7 = 0; uVar7 < MechanismCount; uVar7 = uVar7 + 1) {
        pcVar8 = *(char **)((long)__ptr + (ulong)uVar7 * 8);
        pcVar5 = get_mechanism_name((CK_ULONG)pcVar8);
        if (pcVar5 == (char *)0x0) {
          __format = "0x%lX (0x%lX)";
          pcVar5 = pcVar8;
        }
        else {
          __format = "%s (0x%lX)";
        }
        sprintf(bufmech,__format,pcVar5,pcVar8);
        p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
        pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(bufmech,-1);
        (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar4,pTVar6);
      }
      free(__ptr);
      (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar4);
      return 0;
    }
    pPVar9 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "invalid handle";
  }
  else {
    pPVar9 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "wrong # args: should be \"pki::pkcs11::mechanism handle slot \"";
  }
  pTVar4 = (*tclStubsPtr->tcl_NewStringObj)(pcVar8,-1);
  (*pPVar9)((Tcl_Interp_conflict *)interp,pTVar4);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_listmechs(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid;
  long slotid_long;
  int tcl_rv;
  CK_MECHANISM_TYPE_PTR MechanismList = NULL;  // Head to Mechanism list
  CK_ULONG       MechanismCount = 0;  // Number of supported mechanisms
  unsigned int   lcv2;           // Loop Control Variables
  CK_CHAR *name;
  CK_SLOT_ID slotid;
  Tcl_Obj *curr_item_list;
  char bufmech[256];


  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 3) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::mechanism handle slot \"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;
  tcl_rv = handle->pkcs11->C_GetMechanismList(slotid, NULL, &MechanismCount);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  /* Allocate enough memory to store all the supported mechanisms */
  MechanismList = (CK_MECHANISM_TYPE_PTR) malloc(MechanismCount *sizeof(CK_MECHANISM_TYPE));

  /* This time get the mechanism list */
  tcl_rv = handle->pkcs11->C_GetMechanismList(slotid, MechanismList, &MechanismCount);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  /* For each Mechanism in the List */
  curr_item_list = Tcl_NewObj();
  for (lcv2 = 0; lcv2 < MechanismCount; lcv2++){
    /* Get the Mechanism Info and display it */
    name = (CK_CHAR *)get_mechanism_name(MechanismList[lcv2]);
    if (name) {
      sprintf((char *)bufmech, "%s (0x%lX)", name, MechanismList[lcv2]);
    } else {
      sprintf((char *)bufmech, "0x%lX (0x%lX)", MechanismList[lcv2], MechanismList[lcv2]);
    }
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj(bufmech, -1));
  }
  /* Free the memory we allocated for the mechanism list */
  free (MechanismList);

  Tcl_SetObjResult(interp, curr_item_list);
  return(TCL_OK);
}